

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::File,_std::nullptr_t> __thiscall kj::newInMemoryFile(kj *this,Clock *clock)

{
  File *extraout_RDX;
  Own<kj::File,_std::nullptr_t> OVar1;
  Clock *local_18;
  Clock *clock_local;
  
  local_18 = clock;
  clock_local = (Clock *)this;
  atomicRefcounted<kj::(anonymous_namespace)::InMemoryFile,kj::Clock_const&>
            ((kj *)&stack0xffffffffffffffd8,clock);
  Own<kj::File,decltype(nullptr)>::Own<kj::(anonymous_namespace)::InMemoryFile,void>
            ((Own<kj::File,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<File> newInMemoryFile(const Clock& clock) {
  return atomicRefcounted<InMemoryFile>(clock);
}